

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

void button_binding_grab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  toggle_modifiers *ptVar1;
  ushort *puVar2;
  undefined8 uVar3;
  
  uVar3 = 0x10490e;
  xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                  binding->keyboard_mode,0,binding->cursor,binding->button,binding->modifiers,
                  0x10490e);
  ptVar1 = state->button_state->modifiers;
  if (ptVar1 != (toggle_modifiers *)0x0) {
    for (puVar2 = ptVar1->masks; *puVar2 != 0; puVar2 = puVar2 + 1) {
      xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                      binding->keyboard_mode,0,binding->cursor,binding->button,
                      *puVar2 | binding->modifiers,uVar3);
    }
  }
  return;
}

Assistant:

void button_binding_grab(const struct natwm_state *state, xcb_window_t window,
                         const struct button_binding *binding)
{
        xcb_grab_button(state->xcb,
                        binding->pass_event,
                        window,
                        binding->mask,
                        binding->pointer_mode,
                        binding->keyboard_mode,
                        XCB_NONE,
                        binding->cursor,
                        binding->button,
                        binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; mask++) {
                xcb_grab_button(state->xcb,
                                binding->pass_event,
                                window,
                                binding->mask,
                                binding->pointer_mode,
                                binding->keyboard_mode,
                                XCB_NONE,
                                binding->cursor,
                                binding->button,
                                binding->modifiers | *mask);
        }
}